

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toeplitz_plus_hankel_system_solver.h
# Opt level: O0

void __thiscall sptk::ToeplitzPlusHankelSystemSolver::Buffer::Buffer(Buffer *this)

{
  undefined8 *in_RDI;
  allocator_type *in_stack_ffffffffffffff60;
  size_type in_stack_ffffffffffffff68;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff70;
  
  *in_RDI = &PTR__Buffer_00146260;
  std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::vector
            ((vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *)0x10ade7);
  std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::vector
            ((vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *)0x10adfd);
  std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::vector
            ((vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *)0x10ae13);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x10ae29);
  std::allocator<double>::allocator((allocator<double> *)0x10ae52);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::allocator<double>::~allocator((allocator<double> *)0x10ae7b);
  std::allocator<double>::allocator((allocator<double> *)0x10ae9e);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::allocator<double>::~allocator((allocator<double> *)0x10aec1);
  std::allocator<double>::allocator((allocator<double> *)0x10aee6);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::allocator<double>::~allocator((allocator<double> *)0x10af09);
  std::allocator<double>::allocator((allocator<double> *)0x10af2e);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::allocator<double>::~allocator((allocator<double> *)0x10af51);
  Matrix2D::Matrix2D((Matrix2D *)(in_RDI + 0x19));
  Matrix2D::Matrix2D((Matrix2D *)(in_RDI + 0x1e));
  Matrix2D::Matrix2D((Matrix2D *)(in_RDI + 0x23));
  Matrix2D::Matrix2D((Matrix2D *)(in_RDI + 0x28));
  Matrix2D::Matrix2D((Matrix2D *)(in_RDI + 0x2d));
  Matrix2D::Matrix2D((Matrix2D *)(in_RDI + 0x32));
  return;
}

Assistant:

Buffer() : ep_(2), g_(2), bar_(2), tmp_vector_(2) {
    }